

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode93Writer.cpp
# Opt level: O2

int ZXing::OneD::ComputeChecksumIndex(string *contents,int maxWeight)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)contents->_M_string_length;
  iVar5 = 0;
  iVar3 = 1;
  while (0 < (int)uVar6) {
    lVar2 = uVar6 - 1;
    uVar6 = uVar6 - 1;
    iVar4 = IndexOf("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%abcd*",
                    (contents->_M_dataplus)._M_p[lVar2]);
    iVar5 = iVar5 + iVar4 * iVar3;
    bVar1 = maxWeight <= iVar3;
    iVar3 = iVar3 + 1;
    if (bVar1) {
      iVar3 = 1;
    }
  }
  return iVar5 % 0x2f;
}

Assistant:

static int ComputeChecksumIndex(const std::string& contents, int maxWeight)
{
	int weight = 1;
	int total = 0;

	for (int i = Size(contents) - 1; i >= 0; i--) {
		int indexInString = IndexOf(ALPHABET, contents[i]);
		total += indexInString * weight;
		if (++weight > maxWeight) {
			weight = 1;
		}
	}
	return total % 47;
}